

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplewidgets.cpp
# Opt level: O1

void __thiscall QAccessibleButton::doAction(QAccessibleButton *this)

{
  QString *in_RSI;
  
  doAction((QAccessibleButton *)&this[-1].super_QAccessibleWidget.super_QAccessibleActionInterface,
           in_RSI);
  return;
}

Assistant:

void QAccessibleButton::doAction(const QString &actionName)
{
    if (!widget()->isEnabled())
        return;
    if (actionName == pressAction() ||
        actionName == showMenuAction()) {
#if QT_CONFIG(menu)
        QPushButton *pb = qobject_cast<QPushButton*>(object());
        if (pb && pb->menu())
            pb->showMenu();
        else
#endif
            button()->animateClick();
    } else if (actionName == toggleAction()) {
        button()->toggle();
    } else {
        QAccessibleWidget::doAction(actionName);
    }
}